

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableIntTest_NopointerSerialization_Test<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_NopointerSerialization_Test<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  iterator iVar2;
  bool bVar3;
  pair<const_int,_int> pVar4;
  FILE *__stream;
  ulong uVar5;
  int i;
  int index;
  char *pcVar6;
  SetKey *pSVar7;
  internal iVar8;
  float fVar9;
  pair<unsigned_long,_unsigned_long> pVar10;
  TypeParam ht_in;
  TypeParam ht_out;
  TransparentHasher local_1e0;
  AssertHelper local_1d0;
  undefined1 local_1c8 [8];
  undefined8 *local_1c0;
  SetKey local_1b1;
  iterator local_1b0;
  undefined1 *local_168;
  undefined1 local_160 [16];
  undefined1 local_150 [28];
  float local_134;
  undefined1 local_130;
  undefined8 local_118;
  sparsetable<std::pair<int_const,int>,(unsigned_short)48,Alloc<std::pair<int_const,int>,unsigned_long,18446744073709551615ul>>
  local_110 [56];
  int *local_d8;
  undefined **local_c8;
  undefined1 local_c0 [144];
  
  local_1b0.ht = (sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)0x0;
  local_1b0.pos.row_begin._M_current = local_1b0.pos.row_begin._M_current & 0xffffffff00000000;
  local_1c8 = (undefined1  [8])0x0;
  local_1c0 = (undefined8 *)((ulong)local_1c0 & 0xffffffff00000000);
  local_160._0_8_ = local_160._0_8_ & 0xffffffff00000000;
  local_160._8_8_ =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_c8 = &PTR__BaseHashtableInterface_00c16ab8;
  pSVar7 = (SetKey *)&local_1d0;
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_c0,0,(TransparentHasher *)&local_1b0,(TransparentHasher *)local_1c8,
                     (SelectKey *)&local_1e0,pSVar7,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_160);
  local_c8 = &PTR__BaseHashtableInterface_00c16a38;
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(2000);
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_c0);
  local_c0[0x2a] = true;
  local_c0._60_4_ = pVar4.first;
  index = 1;
  do {
    local_1b0.ht = (sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)UniqueObjectHelper<std::pair<int_const,int>>(index);
    google::
    sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta((sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_c0,1);
    google::
    sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize((pair<google::sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                       *)local_160,
                      (sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                       *)local_c0,(const_reference)&local_1b0);
    index = index + 1;
  } while (index != 100);
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(0x38);
  local_160._0_4_ = pVar4.first;
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase((sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)local_c0,(key_type *)local_160);
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(0x16);
  local_160._0_4_ = pVar4.first;
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase((sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)local_c0,(key_type *)local_160);
  __stream = tmpfile();
  iVar8 = (internal)(__stream != (FILE *)0x0);
  local_1b0.pos.row_begin._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_1b0.ht._0_1_ = iVar8;
  if (!(bool)iVar8) {
    testing::Message::Message((Message *)local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_160,(internal *)&local_1b0,(AssertionResult *)"fp != __null","false",
               "true",(char *)pSVar7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4d6,(char *)local_160._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if ((sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_160._0_8_ !=
        (sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_150) {
      operator_delete((void *)local_160._0_8_);
    }
    if (local_1c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1c8 + 8))();
    }
    iVar2._M_current = local_1b0.pos.row_begin._M_current;
    if (local_1b0.pos.row_begin._M_current !=
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      if ((local_1b0.pos.row_begin._M_current)->group !=
          (pointer)&((local_1b0.pos.row_begin._M_current)->settings).
                    super_alloc_impl<Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
                    .super_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>.
                    count_) {
        operator_delete((local_1b0.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar2._M_current);
    }
  }
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_c0);
  bVar3 = google::
          sparsetable<std::pair<int_const,int>,(unsigned_short)48,Alloc<std::pair<int_const,int>,unsigned_long,18446744073709551615ul>>
          ::
          serialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,_IO_FILE>
                    ((sparsetable<std::pair<int_const,int>,(unsigned_short)48,Alloc<std::pair<int_const,int>,unsigned_long,18446744073709551615ul>>
                      *)(local_c0 + 0x48));
  local_1b0.ht = (sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1b0.ht._1_7_,bVar3);
  local_1b0.pos.row_begin._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_160,(internal *)&local_1b0,
               (AssertionResult *)"ht_out.serialize(typename TypeParam::NopointerSerializer(), fp)",
               "false","true",(char *)pSVar7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4d7,(char *)local_160._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if ((sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_160._0_8_ !=
        (sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_150) {
      operator_delete((void *)local_160._0_8_);
    }
    if (local_1c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1c8 + 8))();
    }
    iVar2._M_current = local_1b0.pos.row_begin._M_current;
    if (local_1b0.pos.row_begin._M_current !=
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      if ((local_1b0.pos.row_begin._M_current)->group !=
          (pointer)&((local_1b0.pos.row_begin._M_current)->settings).
                    super_alloc_impl<Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
                    .super_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>.
                    count_) {
        operator_delete((local_1b0.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar2._M_current);
    }
  }
  rewind(__stream);
  local_1c8 = (undefined1  [8])0x0;
  local_1c0 = (undefined8 *)((ulong)local_1c0 & 0xffffffff00000000);
  local_1e0.super_Hasher.id_ = 0;
  local_1e0.super_Hasher.num_hashes_ = 0;
  local_1e0.super_Hasher.num_compares_ = 0;
  local_1b0.ht = (sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)((ulong)local_1b0.ht & 0xffffffff00000000);
  local_1b0.pos.row_begin._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  this_00 = (sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)(local_160 + 8);
  local_160._0_8_ = &PTR__BaseHashtableInterface_00c16ab8;
  pSVar7 = &local_1b1;
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(this_00,0,(TransparentHasher *)local_1c8,&local_1e0,(SelectKey *)&local_1d0,
                     pSVar7,(Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_1b0);
  local_160._0_8_ = &PTR__BaseHashtableInterface_00c16a38;
  local_1c0 = (undefined8 *)0x0;
  local_1c8[0] = iVar8;
  if (__stream == (FILE *)0x0) {
    testing::Message::Message((Message *)&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1b0,(internal *)local_1c8,(AssertionResult *)"fp != __null","false",
               "true",(char *)pSVar7);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4db,(char *)local_1b0.ht);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1b0.ht !=
        (sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1b0.pos.row_end) {
      operator_delete(local_1b0.ht);
    }
    if ((pair<const_int,_int>)local_1e0.super_Hasher._0_8_ != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_1e0.super_Hasher._0_8_ + 8))();
    }
    puVar1 = local_1c0;
    if (local_1c0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1c0 != local_1c0 + 2) {
        operator_delete((undefined8 *)*local_1c0);
      }
      operator_delete(puVar1);
    }
  }
  local_118._0_4_ = 0;
  local_118._4_4_ = 0;
  local_1c8[0] = (internal)
                 google::
                 sparsetable<std::pair<int_const,int>,(unsigned_short)48,Alloc<std::pair<int_const,int>,unsigned_long,18446744073709551615ul>>
                 ::
                 unserialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,_IO_FILE>
                           (local_110,__stream);
  fVar9 = (float)local_150._24_4_ * (float)local_d8;
  uVar5 = (ulong)fVar9;
  local_150._8_8_ = (long)(fVar9 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  local_134 = (float)local_d8 * local_134;
  uVar5 = (ulong)local_134;
  local_150._16_8_ = (long)(local_134 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  local_130 = 0;
  local_1c0 = (undefined8 *)0x0;
  if (!(bool)local_1c8[0]) {
    testing::Message::Message((Message *)&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1b0,(internal *)local_1c8,
               (AssertionResult *)"ht_in.unserialize(typename TypeParam::NopointerSerializer(), fp)"
               ,"false","true",(char *)pSVar7);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4dc,(char *)local_1b0.ht);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1b0.ht !=
        (sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1b0.pos.row_end) {
      operator_delete(local_1b0.ht);
    }
    if ((pair<const_int,_int>)local_1e0.super_Hasher._0_8_ != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_1e0.super_Hasher._0_8_ + 8))();
    }
    puVar1 = local_1c0;
    if (local_1c0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1c0 != local_1c0 + 2) {
        operator_delete((undefined8 *)*local_1c0);
      }
      operator_delete(puVar1);
    }
  }
  fclose(__stream);
  local_1e0.super_Hasher._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(1);
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_1d0.data_._0_4_ = pVar4.first;
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>(&local_1b0,this_00,(int *)&local_1d0);
  local_168 = local_160;
  testing::internal::CmpHelperEQ<std::pair<int_const,int>,std::pair<int_const,int>>
            ((internal *)local_1c8,"this->UniqueObject(1)","*ht_in.find(this->UniqueKey(1))",
             (pair<const_int,_int> *)&local_1e0,local_1b0.pos.col_current);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b0);
    if (local_1c0 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_1c0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4df,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (local_1b0.ht !=
        (sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1b0.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> +
                  8))();
    }
  }
  puVar1 = local_1c0;
  if (local_1c0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1c0 != local_1c0 + 2) {
      operator_delete((undefined8 *)*local_1c0);
    }
    operator_delete(puVar1);
  }
  local_1e0.super_Hasher._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(99);
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(99);
  local_1d0.data_._0_4_ = pVar4.first;
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>(&local_1b0,this_00,(int *)&local_1d0);
  local_168 = local_160;
  testing::internal::CmpHelperEQ<std::pair<int_const,int>,std::pair<int_const,int>>
            ((internal *)local_1c8,"this->UniqueObject(99)","*ht_in.find(this->UniqueKey(99))",
             (pair<const_int,_int> *)&local_1e0,local_1b0.pos.col_current);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b0);
    if (local_1c0 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_1c0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4e0,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (local_1b0.ht !=
        (sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1b0.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> +
                  8))();
    }
  }
  puVar1 = local_1c0;
  if (local_1c0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1c0 != local_1c0 + 2) {
      operator_delete((undefined8 *)*local_1c0);
    }
    operator_delete(puVar1);
  }
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(100);
  local_1b0.ht = (sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1b0.ht._4_4_,pVar4.first);
  pVar10 = google::
           sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(this_00,(int *)&local_1b0);
  bVar3 = pVar10.first == 0xffffffffffffffff;
  local_1c8[0] = (internal)bVar3;
  local_1c0 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1b0,(internal *)local_1c8,
               (AssertionResult *)"ht_in.count(this->UniqueKey(100))","true","false",(char *)pSVar7)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4e1,(char *)local_1b0.ht);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1b0.ht !=
        (sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1b0.pos.row_end) {
      operator_delete(local_1b0.ht);
    }
    if ((pair<const_int,_int>)local_1e0.super_Hasher._0_8_ != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_1e0.super_Hasher._0_8_ + 8))();
    }
    puVar1 = local_1c0;
    if (local_1c0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1c0 != local_1c0 + 2) {
        operator_delete((undefined8 *)*local_1c0);
      }
      operator_delete(puVar1);
    }
  }
  local_1e0.super_Hasher._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x15);
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(0x15);
  local_1d0.data_._0_4_ = pVar4.first;
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>(&local_1b0,this_00,(int *)&local_1d0);
  local_168 = local_160;
  testing::internal::CmpHelperEQ<std::pair<int_const,int>,std::pair<int_const,int>>
            ((internal *)local_1c8,"this->UniqueObject(21)","*ht_in.find(this->UniqueKey(21))",
             (pair<const_int,_int> *)&local_1e0,local_1b0.pos.col_current);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b0);
    if (local_1c0 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_1c0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4e2,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (local_1b0.ht !=
        (sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1b0.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> +
                  8))();
    }
  }
  puVar1 = local_1c0;
  if (local_1c0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1c0 != local_1c0 + 2) {
      operator_delete((undefined8 *)*local_1c0);
    }
    operator_delete(puVar1);
  }
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(0x16);
  local_1b0.ht = (sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1b0.ht._4_4_,pVar4.first);
  pVar10 = google::
           sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(this_00,(int *)&local_1b0);
  iVar8 = (internal)(pVar10.first == 0xffffffffffffffff);
  local_1c0 = (undefined8 *)0x0;
  local_1c8[0] = iVar8;
  if (!(bool)iVar8) {
    testing::Message::Message((Message *)&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1b0,(internal *)local_1c8,
               (AssertionResult *)"ht_in.count(this->UniqueKey(22))","true","false",(char *)pSVar7);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4e4,(char *)local_1b0.ht);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1b0.ht !=
        (sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1b0.pos.row_end) {
      operator_delete(local_1b0.ht);
    }
    if ((pair<const_int,_int>)local_1e0.super_Hasher._0_8_ != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_1e0.super_Hasher._0_8_ + 8))();
    }
    puVar1 = local_1c0;
    if (local_1c0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1c0 != local_1c0 + 2) {
        operator_delete((undefined8 *)*local_1c0);
      }
      operator_delete(puVar1);
    }
  }
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(0x38);
  local_1b0.ht = (sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1b0.ht._4_4_,pVar4.first);
  pVar10 = google::
           sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(this_00,(int *)&local_1b0);
  local_1c8[0] = (internal)(pVar10.first == 0xffffffffffffffff);
  local_1c0 = (undefined8 *)0x0;
  if (!(bool)local_1c8[0]) {
    testing::Message::Message((Message *)&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1b0,(internal *)local_1c8,
               (AssertionResult *)"ht_in.count(this->UniqueKey(56))","true","false",(char *)pSVar7);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4e5,(char *)local_1b0.ht);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1b0.ht !=
        (sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1b0.pos.row_end) {
      operator_delete(local_1b0.ht);
    }
    if ((pair<const_int,_int>)local_1e0.super_Hasher._0_8_ != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_1e0.super_Hasher._0_8_ + 8))();
    }
    puVar1 = local_1c0;
    if (local_1c0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1c0 != local_1c0 + 2) {
        operator_delete((undefined8 *)*local_1c0);
      }
      operator_delete(puVar1);
    }
  }
  local_160._0_8_ = &PTR__BaseHashtableInterface_00c16ab8;
  std::
  vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             *)local_110);
  local_c8 = &PTR__BaseHashtableInterface_00c16ab8;
  std::
  vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             *)(local_c0 + 0x48));
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, NopointerSerialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(typename TypeParam::NopointerSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(typename TypeParam::NopointerSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}